

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

void __thiscall
nlohmann::json_abi_v3_11_2::
basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
::basic_json(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             *this,basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *other)

{
  json_value local_58;
  json_value local_50;
  json_value local_48;
  json_value local_40;
  json_value local_38;
  json_value local_30;
  json_value local_28;
  json_value local_20;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *local_18;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *other_local;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *this_local;
  
  this->m_type = other->m_type;
  (this->m_value).object = (object_t *)0x0;
  local_18 = other;
  other_local = this;
  assert_invariant(other,true);
  switch(this->m_type) {
  case null:
  case discarded:
    break;
  case object:
    json_value::json_value((json_value *)&local_20.boolean,(local_18->m_value).object);
    this->m_value = local_20;
    break;
  case array:
    json_value::json_value((json_value *)&local_28.boolean,(local_18->m_value).array);
    this->m_value = local_28;
    break;
  case string:
    json_value::json_value((json_value *)&local_30.boolean,(local_18->m_value).string);
    this->m_value = local_30;
    break;
  case boolean:
    json_value::json_value
              ((json_value *)&local_38.boolean,(boolean_t)((local_18->m_value).boolean & 1));
    this->m_value = local_38;
    break;
  case number_integer:
    json_value::json_value((json_value *)&local_40.boolean,(local_18->m_value).number_integer);
    this->m_value = local_40;
    break;
  case number_unsigned:
    json_value::json_value((json_value *)&local_48.boolean,(local_18->m_value).number_unsigned);
    this->m_value = local_48;
    break;
  case number_float:
    json_value::json_value((json_value *)&local_50.boolean,(local_18->m_value).number_float);
    this->m_value = local_50;
    break;
  case binary:
    json_value::json_value((json_value *)&local_58.boolean,(local_18->m_value).binary);
    this->m_value = local_58;
  }
  set_parents(this);
  assert_invariant(this,true);
  return;
}

Assistant:

basic_json(const basic_json& other)
        : m_type(other.m_type)
    {
        // check of passed value is valid
        other.assert_invariant();

        switch (m_type)
        {
            case value_t::object:
            {
                m_value = *other.m_value.object;
                break;
            }

            case value_t::array:
            {
                m_value = *other.m_value.array;
                break;
            }

            case value_t::string:
            {
                m_value = *other.m_value.string;
                break;
            }

            case value_t::boolean:
            {
                m_value = other.m_value.boolean;
                break;
            }

            case value_t::number_integer:
            {
                m_value = other.m_value.number_integer;
                break;
            }

            case value_t::number_unsigned:
            {
                m_value = other.m_value.number_unsigned;
                break;
            }

            case value_t::number_float:
            {
                m_value = other.m_value.number_float;
                break;
            }

            case value_t::binary:
            {
                m_value = *other.m_value.binary;
                break;
            }

            case value_t::null:
            case value_t::discarded:
            default:
                break;
        }

        set_parents();
        assert_invariant();
    }